

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O1

link_map * get_vdso_from_maps(void)

{
  link_map *plVar1;
  bool bVar2;
  int __fd;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  int *piVar6;
  long lVar7;
  int i;
  long lVar8;
  char *pcVar9;
  int unaff_R15D;
  Elf64_Addr addr_end;
  Elf64_Addr addr_begin;
  char line [4096];
  char name [4096];
  Elf64_Dyn *local_2048;
  Elf64_Dyn *local_2040;
  char local_2038 [4096];
  undefined4 local_1038;
  undefined3 uStack_1034;
  
  lVar8 = 0;
  local_2040 = (Elf64_Dyn *)0x0;
  local_2048 = (Elf64_Dyn *)0x0;
  memset(&local_1038,0,0x1000);
  memset(local_2038,0,0x1000);
  __fd = open("/proc/self/maps",0);
LAB_00223440:
  do {
    pcVar9 = local_2038 + lVar8;
    sVar5 = read(__fd,pcVar9,1);
    if ((int)sVar5 == -1) {
      piVar6 = __errno_location();
      bVar2 = false;
      iVar3 = unaff_R15D;
      if (*piVar6 != 4) goto LAB_0022346f;
    }
    else {
LAB_0022346f:
      iVar3 = -1;
      if (1 < (int)sVar5 + 1U) {
        bVar2 = false;
        iVar3 = unaff_R15D;
        if (*pcVar9 != '\n') goto LAB_00223498;
        pcVar9 = local_2038 + lVar8 + 1;
        iVar3 = 0;
      }
      *pcVar9 = '\0';
      bVar2 = true;
    }
LAB_00223498:
    unaff_R15D = iVar3;
    if (bVar2) {
      if (iVar3 != 0) {
        close(__fd);
        return (link_map *)0x0;
      }
    }
    else {
      lVar8 = lVar8 + 1;
      if (lVar8 != 0xfff) goto LAB_00223440;
      local_2038[0xfff] = 0;
    }
    iVar3 = read_hex(local_2038,(unsigned_long *)&local_2040);
    lVar7 = (long)iVar3;
    lVar8 = 0;
    if (local_2038[lVar7] == '-') {
      iVar3 = read_hex(local_2038 + lVar7 + 1,(unsigned_long *)&local_2048);
      pcVar9 = local_2038 + iVar3 + lVar7 + 1;
      iVar3 = read_word(pcVar9,(char *)0x0,0);
      pcVar9 = pcVar9 + iVar3;
      iVar3 = read_word(pcVar9,(char *)0x0,0);
      pcVar9 = pcVar9 + iVar3;
      iVar3 = read_word(pcVar9,(char *)0x0,0);
      iVar4 = read_word(pcVar9 + iVar3,(char *)0x0,0);
      read_word(pcVar9 + iVar3 + iVar4,(char *)&local_1038,0x1000);
      lVar8 = 0;
      if (CONCAT31(uStack_1034,local_1038._3_1_) == 0x5d6f73 && local_1038 == 0x7364765b) {
        close(__fd);
        plVar1 = ___throw_regex_error;
        while( true ) {
          if (plVar1 == (link_map *)0x0) {
            return (link_map *)0x0;
          }
          if ((local_2040 <= plVar1->l_ld) && (plVar1->l_ld < local_2048)) break;
          plVar1 = plVar1->l_next;
        }
        return plVar1;
      }
    }
  } while( true );
}

Assistant:

struct link_map *get_vdso_from_maps() {
  int maps = 0, hit_eof = 0;
  ElfW(Addr) addr_begin = 0, addr_end = 0, dynamic = 0;
  char name[BUFFER_LEN] = {'\0'}, line[BUFFER_LEN] = {'\0'}, *line_pos = NULL;
  struct link_map *m = NULL;
  maps = gotcha_open("/proc/self/maps", O_RDONLY);
  for (;;) {
    hit_eof = read_line(line, BUFFER_LEN, maps);
    if (hit_eof) {
      gotcha_close(maps);  // GCOVR_EXCL_LINE
      return NULL;         // GCOVR_EXCL_LINE
    }
    line_pos = line;
    line_pos += read_hex(line_pos, &addr_begin);
    if (*line_pos != '-') continue;  // GCOVR_EXCL_LINE
    line_pos++;
    line_pos += read_hex(line_pos, &addr_end);
    line_pos += read_word(line_pos, NULL, 0);
    line_pos += read_word(line_pos, NULL, 0);
    line_pos += read_word(line_pos, NULL, 0);
    line_pos += read_word(line_pos, NULL, 0);
    line_pos += read_word(line_pos, name, sizeof(name));
    if (gotcha_strcmp(name, "[vdso]") == 0) {
      gotcha_close(maps);
      break;
    }
  }

  for (m = _r_debug.r_map; m; m = m->l_next) {
    dynamic = (ElfW(Addr))m->l_ld;
    if (dynamic >= addr_begin && dynamic < addr_end) return m;
  }

  return NULL;  // GCOVR_EXCL_LINE
}